

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execMull<(moira::Core)2,(moira::Instr)156,(moira::Mode)10,4>(Moira *this,u16 opcode)

{
  this->cp = 0;
  execMullMusashi<(moira::Core)2,(moira::Instr)156,(moira::Mode)10,4>(this,opcode);
  (*this->_vptr_Moira[2])(this,(ulong)(this->cp + 0x32));
  return;
}

Assistant:

void
Moira::execMull(u16 opcode)
{
    AVAILABILITY(Core::C68020)

    if constexpr (MOIRA_MIMIC_MUSASHI) {
        execMullMusashi<C, I, M, S>(opcode);
    } else {
        execMullMoira<C, I, M, S>(opcode);
    }

    //           00  10  20        00  10  20        00  10  20
    //           .b  .b  .b        .w  .w  .w        .l  .l  .l
    CYCLES_DN   ( 0,  0,  0,        0,  0, 43,        0,  0, 43)
    CYCLES_AI   ( 0,  0,  0,        0,  0, 47,        0,  0, 47)
    CYCLES_PI   ( 0,  0,  0,        0,  0, 47,        0,  0, 47)
    CYCLES_PD   ( 0,  0,  0,        0,  0, 48,        0,  0, 48)
    CYCLES_DI   ( 0,  0,  0,        0,  0, 48,        0,  0, 48)
    CYCLES_IX   ( 0,  0,  0,        0,  0, 50,        0,  0, 50)
    CYCLES_AW   ( 0,  0,  0,        0,  0, 47,        0,  0, 47)
    CYCLES_AL   ( 0,  0,  0,        0,  0, 47,        0,  0, 47)
    CYCLES_DIPC ( 0,  0,  0,        0,  0, 48,        0,  0, 48)
    CYCLES_IXPC ( 0,  0,  0,        0,  0, 50,        0,  0, 50)
    CYCLES_IM   ( 0,  0,  0,        0,  0, 47,        0,  0, 47)

    FINALIZE;
}